

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

bool anon_unknown.dwarf_e9e4d4::ParseKeyPath
               (vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *split,
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *out,bool *apostrophe,string *error,bool allow_multipath)

{
  long lVar1;
  pointer pSVar2;
  anon_unknown_dwarf_e9e4d4 *this;
  char *pcVar3;
  bool bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  ulong uVar5;
  undefined7 in_register_00000081;
  string *error_00;
  ulong uVar6;
  pointer pSVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  __ireturn_type _Var9;
  Span<const_char> elem;
  Span<const_char> elem_00;
  string_view separators;
  long local_f8;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  seen_multipath;
  vector<unsigned_int,_std::allocator<unsigned_int>_> multipath_values;
  KeyPath path;
  _Optional_payload_base<unsigned_int> local_80;
  vector<Span<const_char>,_std::allocator<Span<const_char>_>_> nums;
  KeyPath branch_path;
  
  error_00 = (string *)CONCAT71(in_register_00000081,allow_multipath);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  multipath_values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  multipath_values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  multipath_values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  seen_multipath._M_h._M_buckets = &seen_multipath._M_h._M_single_bucket;
  seen_multipath._M_h._M_bucket_count = 1;
  seen_multipath._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  seen_multipath._M_h._M_element_count = 0;
  seen_multipath._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  seen_multipath._M_h._M_rehash_policy._M_next_resize = 0;
  seen_multipath._M_h._M_single_bucket = (__node_base_ptr)0x0;
  uVar8 = 1;
  bVar4 = false;
  do {
    pSVar2 = (split->super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    uVar5 = (long)(split->super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>).
                  _M_impl.super__Vector_impl_data._M_finish - (long)pSVar2 >> 4;
    if (uVar5 <= uVar8) {
      if (bVar4) {
        for (uVar6 = 0;
            uVar6 < (ulong)((long)multipath_values.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)multipath_values.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 2); uVar6 = uVar6 + 1)
        {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &branch_path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,
                     &path);
          branch_path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[local_f8] =
               multipath_values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar6];
          std::
          vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
          ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                    ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                      *)out,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            &branch_path.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    (&branch_path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
        }
      }
      else {
        std::
        vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
        ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                  ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                    *)out,&path);
      }
LAB_0031107d:
      std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&seen_multipath._M_h);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&multipath_values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return uVar5 <= uVar8;
      }
      __stack_chk_fail();
    }
    args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(uVar8 * 0x10);
    this = *(anon_unknown_dwarf_e9e4d4 **)((long)&(args->_M_dataplus)._M_p + (long)pSVar2);
    pcVar3 = *(char **)((long)&args->_M_string_length + (long)pSVar2);
    if (((pcVar3 == (char *)0x0) || (*this != (anon_unknown_dwarf_e9e4d4)0x3c)) ||
       ((this + -1)[(long)pcVar3] != (anon_unknown_dwarf_e9e4d4)0x3e)) {
      elem_00.m_size = (size_t)apostrophe;
      elem_00.m_data = pcVar3;
      branch_path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)ParseKeyPathNum(this,elem_00,(bool *)error,error_00);
      if (((ulong)branch_path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start & 0x100000000) == 0) goto LAB_0031107d;
      std::vector<unsigned_int,std::allocator<unsigned_int>>::emplace_back<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&path,(uint *)&branch_path);
    }
    else {
      if (!allow_multipath) {
        nums.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&nums.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>((string *)&nums,this,pcVar3 + (long)this);
        tinyformat::format<std::__cxx11::string>
                  ((string *)&branch_path,
                   (tinyformat *)
                   "Key path value \'%s\' specifies multipath in a section where multipath is not allowed"
                   ,(char *)&nums,args);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (error,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &branch_path);
        std::__cxx11::string::~string((string *)&branch_path);
        std::__cxx11::string::~string((string *)&nums);
        goto LAB_0031107d;
      }
      if (bVar4) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                  (error,"Multiple multipath key path specifiers found");
        goto LAB_0031107d;
      }
      branch_path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)(this + 1);
      branch_path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)(this + (long)pcVar3 +
                    (-1 - (long)branch_path.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start));
      separators._M_str = (char *)error_00;
      separators._M_len = (size_t)";";
      util::Split<Span<char_const>>(&nums,(util *)&branch_path,(Span<const_char> *)0x1,separators);
      pSVar2 = nums.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl
               .super__Vector_impl_data._M_finish;
      pSVar7 = nums.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl
               .super__Vector_impl_data._M_start;
      if ((ulong)((long)nums.
                        super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)nums.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) < 0x11) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                  (error,"Multipath key path specifiers must have at least two items");
LAB_00311070:
        std::_Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>::~_Vector_base
                  (&nums.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>);
        goto LAB_0031107d;
      }
      for (; pSVar7 != pSVar2; pSVar7 = pSVar7 + 1) {
        elem.m_size = (size_t)apostrophe;
        elem.m_data = (char *)pSVar7->m_size;
        local_80 = (_Optional_payload_base<unsigned_int>)
                   ParseKeyPathNum((anon_unknown_dwarf_e9e4d4 *)pSVar7->m_data,elem,(bool *)error,
                                   error_00);
        if (((ulong)local_80 & 0x100000000) == 0) goto LAB_00311070;
        _Var9 = std::__detail::
                _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                          *)&seen_multipath,(value_type *)&local_80);
        if (((undefined1  [16])_Var9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          tinyformat::format<unsigned_int>
                    ((string *)&branch_path,"Duplicated key path value %u in multipath specifier",
                     (uint *)&local_80);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (error,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &branch_path);
          std::__cxx11::string::~string((string *)&branch_path);
          goto LAB_00311070;
        }
        std::vector<unsigned_int,std::allocator<unsigned_int>>::emplace_back<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&multipath_values,
                   (uint *)&local_80);
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<>(&path);
      local_f8 = ((long)path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                        .super__Vector_impl_data._M_finish -
                  (long)path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                        .super__Vector_impl_data._M_start >> 2) + -1;
      std::_Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>::~_Vector_base
                (&nums.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>);
      bVar4 = true;
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

[[nodiscard]] bool ParseKeyPath(const std::vector<Span<const char>>& split, std::vector<KeyPath>& out, bool& apostrophe, std::string& error, bool allow_multipath)
{
    KeyPath path;
    std::optional<size_t> multipath_segment_index;
    std::vector<uint32_t> multipath_values;
    std::unordered_set<uint32_t> seen_multipath;

    for (size_t i = 1; i < split.size(); ++i) {
        const Span<const char>& elem = split[i];

        // Check if element contain multipath specifier
        if (!elem.empty() && elem.front() == '<' && elem.back() == '>') {
            if (!allow_multipath) {
                error = strprintf("Key path value '%s' specifies multipath in a section where multipath is not allowed", std::string(elem.begin(), elem.end()));
                return false;
            }
            if (multipath_segment_index) {
                error = "Multiple multipath key path specifiers found";
                return false;
            }

            // Parse each possible value
            std::vector<Span<const char>> nums = Split(Span(elem.begin()+1, elem.end()-1), ";");
            if (nums.size() < 2) {
                error = "Multipath key path specifiers must have at least two items";
                return false;
            }

            for (const auto& num : nums) {
                const auto& op_num = ParseKeyPathNum(num, apostrophe, error);
                if (!op_num) return false;
                auto [_, inserted] = seen_multipath.insert(*op_num);
                if (!inserted) {
                    error = strprintf("Duplicated key path value %u in multipath specifier", *op_num);
                    return false;
                }
                multipath_values.emplace_back(*op_num);
            }

            path.emplace_back(); // Placeholder for multipath segment
            multipath_segment_index = path.size()-1;
        } else {
            const auto& op_num = ParseKeyPathNum(elem, apostrophe, error);
            if (!op_num) return false;
            path.emplace_back(*op_num);
        }
    }

    if (!multipath_segment_index) {
        out.emplace_back(std::move(path));
    } else {
        // Replace the multipath placeholder with each value while generating paths
        for (size_t i = 0; i < multipath_values.size(); i++) {
            KeyPath branch_path = path;
            branch_path[*multipath_segment_index] = multipath_values[i];
            out.emplace_back(std::move(branch_path));
        }
    }
    return true;
}